

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_tostring(lua_State *L,StkId obj)

{
  int iVar1;
  GCObject *pGVar2;
  bool bVar3;
  TString *x_;
  TValue *io;
  int l;
  lua_Number n;
  char s [32];
  StkId obj_local;
  lua_State *L_local;
  
  bVar3 = obj->tt_ == 3;
  if (bVar3) {
    iVar1 = sprintf((char *)&n,"%.14g",(obj->value_).gc);
    pGVar2 = (GCObject *)luaS_newlstr(L,(char *)&n,(long)iVar1);
    (obj->value_).gc = pGVar2;
    obj->tt_ = (pGVar2->gch).tt | 0x40;
  }
  L_local._4_4_ = (uint)bVar3;
  return L_local._4_4_;
}

Assistant:

int luaV_tostring (lua_State *L, StkId obj) {
  if (!ttisnumber(obj))
    return 0;
  else {
    char s[LUAI_MAXNUMBER2STR];
    lua_Number n = nvalue(obj);
    int l = lua_number2str(s, n);
    setsvalue2s(L, obj, luaS_newlstr(L, s, l));
    return 1;
  }
}